

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall CConfigManager::Save(CConfigManager *this,char *pFilename)

{
  long lVar1;
  IStorage *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  uint uVar5;
  char cVar6;
  long lVar7;
  char *pcVar8;
  void **ppvVar9;
  long in_FS_OFFSET;
  char aBuf [256];
  char aEscapeBuf [2048];
  char aLineBuf [2048];
  
  aEscapeBuf[8] = '\0';
  aEscapeBuf[9] = '\0';
  aEscapeBuf[10] = '\0';
  aEscapeBuf[0xb] = '\0';
  aEscapeBuf[0xc] = '\0';
  aEscapeBuf[0xd] = '\0';
  aEscapeBuf[0xe] = '\0';
  aEscapeBuf[0xf] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar2 = this->m_pStorage;
  if (pIVar2 == (IStorage *)0x0) goto LAB_0012998a;
  pcVar8 = "settings07.cfg";
  if (pFilename != (char *)0x0) {
    pcVar8 = pFilename;
  }
  iVar3 = (*(pIVar2->super_IInterface)._vptr_IInterface[4])(pIVar2,pcVar8,2,0,0,0,0,0);
  this->m_ConfigFile = (IOHANDLE)CONCAT44(extraout_var,iVar3);
  if ((IOHANDLE)CONCAT44(extraout_var,iVar3) == (IOHANDLE)0x0) goto LAB_0012998a;
  (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,"# Teeworlds 0.7.5");
  if ((this->m_FlagMask & 3) != 0) {
    if ((this->m_Values).m_ClPredict != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClPredictPlayers != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClPredictProjectiles != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClNameplates != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClNameplatesAlways != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClNameplatesTeamcolors != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClNameplatesSize != 0x32) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClAutoswitchWeapons != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClShowhud != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClShowChat != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClFilterchat != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClDisableWhisper != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClShowsocial != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClShowfps != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClAirjumpindicator != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClWarningTeambalance != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClDynamicCamera != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClMouseDeadzone != 300) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClMouseFollowfactor != 0x3c) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClMouseMaxDistanceDynamic != 1000) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClMouseMaxDistanceStatic != 400) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClCameraSmoothness != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClCameraStabilizing != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClCustomizeSkin != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClShowUserId != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_EdZoomTarget != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_EdShowkeys != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_EdColorGridInner != -0xda) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_EdColorGridOuter != -0xb3b3b4) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_EdColorQuadPoint != -0xffff01) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_EdColorQuadPointHover != -1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_EdColorQuadPointActive != -1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_EdColorQuadPivot != 0xff00ff) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_EdColorQuadPivotHover != -1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_EdColorQuadPivotActive != -1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_EdColorSelectionQuad != -1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_EdColorSelectionTile != -0x9a) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClShowWelcome != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClMotdTime != 10) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClShowXmasHats != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    if ((this->m_Values).m_ClShowEasterEggs != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126274;
    }
    pcVar4 = (this->m_Values).m_ClVersionServer;
    iVar3 = str_comp(pcVar4,"version.teeworlds.com");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_ClVersionServer[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_ClVersionServer[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","cl_version_server",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_00126274:
  if ((this->m_FlagMask & 3) != 0) {
    pcVar4 = (this->m_Values).m_ClLanguagefile;
    iVar3 = str_comp(pcVar4,"");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_ClLanguagefile[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_ClLanguagefile[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","cl_languagefile",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    if ((this->m_Values).m_PlayerColorBody != 0x1b6f74) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126742;
    }
    if ((this->m_Values).m_PlayerColorMarking != -0xffff01) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126742;
    }
    if ((this->m_Values).m_PlayerColorDecoration != 0x1b6f74) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126742;
    }
    if ((this->m_Values).m_PlayerColorHands != 0x1b759e) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126742;
    }
    if ((this->m_Values).m_PlayerColorFeet != 0x1c873e) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126742;
    }
    if ((this->m_Values).m_PlayerColorEyes != 0xff) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126742;
    }
    if ((this->m_Values).m_PlayerUseCustomColorBody != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126742;
    }
    if ((this->m_Values).m_PlayerUseCustomColorMarking != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126742;
    }
    if ((this->m_Values).m_PlayerUseCustomColorDecoration != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126742;
    }
    if ((this->m_Values).m_PlayerUseCustomColorHands != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126742;
    }
    if ((this->m_Values).m_PlayerUseCustomColorFeet != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126742;
    }
    if ((this->m_Values).m_PlayerUseCustomColorEyes != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126742;
    }
    pcVar4 = (this->m_Values).m_PlayerSkin;
    iVar3 = str_comp(pcVar4,"default");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_PlayerSkin[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_PlayerSkin[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","player_skin",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_00126742:
  if ((this->m_FlagMask & 3) != 0) {
    pcVar4 = (this->m_Values).m_PlayerSkinBody;
    iVar3 = str_comp(pcVar4,"standard");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_PlayerSkinBody[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_PlayerSkinBody[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_body",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    pcVar4 = (this->m_Values).m_PlayerSkinMarking;
    iVar3 = str_comp(pcVar4,"");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_PlayerSkinMarking[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_PlayerSkinMarking[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_marking",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    pcVar4 = (this->m_Values).m_PlayerSkinDecoration;
    iVar3 = str_comp(pcVar4,"");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_PlayerSkinDecoration[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_PlayerSkinDecoration[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_decoration",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    pcVar4 = (this->m_Values).m_PlayerSkinHands;
    iVar3 = str_comp(pcVar4,"standard");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_PlayerSkinHands[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_PlayerSkinHands[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_hands",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    pcVar4 = (this->m_Values).m_PlayerSkinFeet;
    iVar3 = str_comp(pcVar4,"standard");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_PlayerSkinFeet[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_PlayerSkinFeet[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_feet",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    pcVar4 = (this->m_Values).m_PlayerSkinEyes;
    iVar3 = str_comp(pcVar4,"standard");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_PlayerSkinEyes[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_PlayerSkinEyes[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_eyes",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    if ((this->m_Values).m_UiBrowserPage != 5) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126c93;
    }
    if ((this->m_Values).m_UiSettingsPage != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126c93;
    }
    pcVar4 = (this->m_Values).m_UiServerAddress;
    iVar3 = str_comp(pcVar4,"localhost:8303");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_UiServerAddress[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_UiServerAddress[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","ui_server_address",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_00126c93:
  if ((this->m_FlagMask & 3) != 0) {
    pcVar4 = (this->m_Values).m_UiServerAddressLan;
    iVar3 = str_comp(pcVar4,"localhost:8303");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_UiServerAddressLan[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_UiServerAddressLan[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","ui_server_address_lan",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    if ((this->m_Values).m_UiMousesens != 100) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126f55;
    }
    if ((this->m_Values).m_UiJoystickSens != 100) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126f55;
    }
    if ((this->m_Values).m_UiAutoswitchInfotab != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126f55;
    }
    if ((this->m_Values).m_UiWideview != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126f55;
    }
    if ((this->m_Values).m_GfxNoclip != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00126f55;
    }
    pcVar4 = (this->m_Values).m_ClMenuMap;
    iVar3 = str_comp(pcVar4,"auto");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_ClMenuMap[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_ClMenuMap[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","cl_menu_map",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_00126f55:
  uVar5 = this->m_FlagMask;
  if ((uVar5 & 3) != 0) {
    if ((this->m_Values).m_ClShowMenuMap != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_0012727a;
    }
    if ((this->m_Values).m_ClMenuAlpha != 0x19) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_0012727a;
    }
    if ((this->m_Values).m_ClRotationRadius != 0x1e) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_0012727a;
    }
    if ((this->m_Values).m_ClRotationSpeed != 0x28) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_0012727a;
    }
    if ((this->m_Values).m_ClCameraSpeed != 5) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_0012727a;
    }
    if ((this->m_Values).m_ClShowStartMenuImages != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_0012727a;
    }
    if ((this->m_Values).m_ClSkipStartMenu != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_0012727a;
    }
    if ((this->m_Values).m_ClHideSelfScore != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_0012727a;
    }
    if ((this->m_Values).m_ClStatboardInfos != 0x4eb) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_0012727a;
    }
    if ((this->m_Values).m_ClShowLocalTimeAlways != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_0012727a;
    }
    if ((this->m_Values).m_ClLastVersionPlayed != 0x704) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
    }
  }
LAB_0012727a:
  if ((uVar5 & 5) != 0) {
    if ((this->m_Values).m_SvWarmup != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001273b4;
    }
    if ((this->m_Values).m_SvCountdown != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001273b4;
    }
    pcVar4 = (this->m_Values).m_SvMotd;
    iVar3 = str_comp(pcVar4,"");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_SvMotd[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_SvMotd[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_motd",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_001273b4:
  if ((this->m_FlagMask & 5) != 0) {
    if ((this->m_Values).m_SvTeamdamage != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001274a9;
    }
    pcVar4 = (this->m_Values).m_SvMaprotation;
    iVar3 = str_comp(pcVar4,"");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_SvMaprotation[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_SvMaprotation[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_maprotation",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_001274a9:
  if ((this->m_FlagMask & 5) != 0) {
    if ((this->m_Values).m_SvMatchesPerMap != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001276be;
    }
    if ((this->m_Values).m_SvMatchSwap != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001276be;
    }
    if ((this->m_Values).m_SvPowerups != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001276be;
    }
    if ((this->m_Values).m_SvScorelimit != 0x14) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001276be;
    }
    if ((this->m_Values).m_SvTimelimit != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001276be;
    }
    pcVar4 = (this->m_Values).m_SvGametype;
    iVar3 = str_comp(pcVar4,"dm");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_SvGametype[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_SvGametype[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_gametype",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_001276be:
  uVar5 = this->m_FlagMask;
  if ((uVar5 & 5) != 0) {
    if ((this->m_Values).m_SvTournamentMode != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvPlayerReadyMode != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvSpamprotection != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvRespawnDelayTDM != 3) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvPlayerSlots != 8) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvSkillLevel != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvTeambalanceTime != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvInactiveKickTime != 3) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvInactiveKick != 2) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvInactiveKickSpec != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvSilentSpectatorMode != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvStrictSpectateMode != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvVoteSpectate != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvVoteSpectateRejoindelay != 3) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvVoteKick != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvVoteKickMin != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00127b91;
    }
    if ((this->m_Values).m_SvVoteKickBantime != 5) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
    }
  }
LAB_00127b91:
  if ((uVar5 & 3) != 0) {
    pcVar4 = (this->m_Values).m_PlayerName;
    iVar3 = str_comp(pcVar4,"nameless tee");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_PlayerName[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_PlayerName[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","player_name",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    pcVar4 = (this->m_Values).m_PlayerClan;
    iVar3 = str_comp(pcVar4,"");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_PlayerClan[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_PlayerClan[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","player_clan",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  uVar5 = this->m_FlagMask;
  if (((uVar5 & 3) != 0) && ((this->m_Values).m_PlayerCountry != -1)) {
    str_format(aLineBuf,0x800,"%s %i");
    (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    uVar5 = this->m_FlagMask;
  }
  if ((uVar5 & 7) != 0) {
    pcVar4 = (this->m_Values).m_Password;
    iVar3 = str_comp(pcVar4,"");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_Password[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_Password[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","password",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 7) != 0) {
    pcVar4 = (this->m_Values).m_Logfile;
    iVar3 = str_comp(pcVar4,"");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_Logfile[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_Logfile[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","logfile",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  uVar5 = this->m_FlagMask;
  if ((uVar5 & 7) != 0) {
    if ((this->m_Values).m_LogfileTimestamp != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 7) == 0) goto LAB_00127f1c;
    }
    if ((this->m_Values).m_ConsoleOutputLevel != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
    }
  }
LAB_00127f1c:
  if ((uVar5 & 3) != 0) {
    if ((this->m_Values).m_ShowConsoleWindow != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001282dc;
    }
    if ((this->m_Values).m_ClCpuThrottle != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001282dc;
    }
    if ((this->m_Values).m_ClLoadCountryFlags != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001282dc;
    }
    if ((this->m_Values).m_ClAutoDemoRecord != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001282dc;
    }
    if ((this->m_Values).m_ClAutoDemoMax != 10) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001282dc;
    }
    if ((this->m_Values).m_ClAutoScreenshot != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001282dc;
    }
    if ((this->m_Values).m_ClAutoStatScreenshot != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001282dc;
    }
    if ((this->m_Values).m_ClAutoScreenshotMax != 10) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001282dc;
    }
    if ((this->m_Values).m_ClShowServerBroadcast != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001282dc;
    }
    if ((this->m_Values).m_ClColoredBroadcast != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001282dc;
    }
    if ((this->m_Values).m_ClSaveServerPasswords != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001282dc;
    }
    pcVar4 = (this->m_Values).m_BrFilterString;
    iVar3 = str_comp(pcVar4,"");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_BrFilterString[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_BrFilterString[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","br_filter_string",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_001282dc:
  if ((this->m_FlagMask & 3) != 0) {
    if ((this->m_Values).m_BrSort != 4) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_BrSortOrder != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_BrMaxRequests != 0x19) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_BrDemoSort != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_BrDemoSortOrder != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_SndBufferSize != 0x200) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_SndRate != 48000) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_SndEnable != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_SndInit != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_SndMusic != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_SndVolume != 100) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_SndNonactiveMute != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_SndAsyncLoading != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxScreen != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxScreenWidth != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxScreenHeight != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxBorderless != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxFullscreen != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxClear != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxVsync != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxDisplayAllModes != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxHighdpi != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxTextureCompression != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxHighDetail != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxTextureQuality != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxFsaaSamples != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxFinish != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxAsyncRender != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxMaxFps != 0x90) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxLimitFps != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_GfxUseX11XRandRWM != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_InpGrab != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_InpMousesens != 100) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    if ((this->m_Values).m_JoystickEnable != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00128d14;
    }
    pcVar4 = (this->m_Values).m_JoystickGUID;
    iVar3 = str_comp(pcVar4,"");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_JoystickGUID[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_JoystickGUID[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","joystick_guid",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_00128d14:
  uVar5 = this->m_FlagMask;
  if ((uVar5 & 3) != 0) {
    if ((this->m_Values).m_JoystickAbsolute != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00128e7e;
    }
    if ((this->m_Values).m_JoystickSens != 100) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00128e7e;
    }
    if ((this->m_Values).m_JoystickX != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00128e7e;
    }
    if ((this->m_Values).m_JoystickY != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00128e7e;
    }
    if ((this->m_Values).m_JoystickTolerance != 5) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
    }
  }
LAB_00128e7e:
  if ((uVar5 & 5) != 0) {
    pcVar4 = (this->m_Values).m_SvName;
    iVar3 = str_comp(pcVar4,"unnamed server");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_SvName[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_SvName[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_name",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 5) != 0) {
    pcVar4 = (this->m_Values).m_SvHostname;
    iVar3 = str_comp(pcVar4,"");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_SvHostname[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_SvHostname[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_hostname",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 0x17) != 0) {
    pcVar4 = (this->m_Values).m_Bindaddr;
    iVar3 = str_comp(pcVar4,"");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_Bindaddr[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_Bindaddr[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","bindaddr",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 5) != 0) {
    if ((this->m_Values).m_SvPort != 0x206f) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001291c6;
    }
    if ((this->m_Values).m_SvExternalPort != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001291c6;
    }
    pcVar4 = (this->m_Values).m_SvMap;
    iVar3 = str_comp(pcVar4,"dm1");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_SvMap[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_SvMap[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_map",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_001291c6:
  if ((this->m_FlagMask & 5) != 0) {
    if ((this->m_Values).m_SvMaxClients != 8) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001293db;
    }
    if ((this->m_Values).m_SvMaxClientsPerIP != 4) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001293db;
    }
    if ((this->m_Values).m_SvMapDownloadSpeed != 8) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001293db;
    }
    if ((this->m_Values).m_SvHighBandwidth != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001293db;
    }
    if ((this->m_Values).m_SvRegister != 1) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001293db;
    }
    pcVar4 = (this->m_Values).m_SvRconPassword;
    iVar3 = str_comp(pcVar4,"");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_SvRconPassword[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_SvRconPassword[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_rcon_password",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_001293db:
  if ((this->m_FlagMask & 5) != 0) {
    pcVar4 = (this->m_Values).m_SvRconModPassword;
    iVar3 = str_comp(pcVar4,"");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_SvRconModPassword[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_SvRconModPassword[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_rcon_mod_password",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 5) != 0) {
    if ((this->m_Values).m_SvRconMaxTries != 3) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_00129656;
    }
    if ((this->m_Values).m_SvRconBantime != 5) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_00129656;
    }
    if ((this->m_Values).m_SvAutoDemoRecord != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_00129656;
    }
    if ((this->m_Values).m_SvAutoDemoMax != 10) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_00129656;
    }
    pcVar4 = (this->m_Values).m_SvMaplist;
    iVar3 = str_comp(pcVar4,"all");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_SvMaplist[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_SvMaplist[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_maplist",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_00129656:
  if ((this->m_FlagMask & 0x21) != 0) {
    pcVar4 = (this->m_Values).m_EcBindaddr;
    iVar3 = str_comp(pcVar4,"localhost");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_EcBindaddr[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_EcBindaddr[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","ec_bindaddr",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 0x21) != 0) {
    if ((this->m_Values).m_EcPort != 0) {
      str_format(aLineBuf,0x800,"%s %i");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 0x21) == 0) goto LAB_001297f9;
    }
    pcVar4 = (this->m_Values).m_EcPassword;
    iVar3 = str_comp(pcVar4,"");
    if (iVar3 != 0) {
      cVar6 = *pcVar4;
      pcVar4 = aEscapeBuf;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          if ((cVar6 == '\\') || (cVar6 == '\"')) {
            *pcVar4 = '\\';
            pcVar4 = pcVar4 + 1;
            cVar6 = (this->m_Values).m_EcPassword[lVar7];
          }
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
          cVar6 = (this->m_Values).m_EcPassword[lVar7 + 1];
        } while ((cVar6 != '\0') && (uVar5 = (uint)lVar7, lVar7 = lVar7 + 1, uVar5 < 0x7fe));
      }
      *pcVar4 = '\0';
      str_format(aLineBuf,0x800,"%s \"%s\"","ec_password",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_001297f9:
  uVar5 = this->m_FlagMask;
  if ((uVar5 & 0x21) != 0) {
    if ((this->m_Values).m_EcBantime != 0) {
      str_format(aLineBuf,0x800,"%s %i","ec_bantime");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 0x21) == 0) goto LAB_001298d2;
    }
    if ((this->m_Values).m_EcAuthTimeout != 0x1e) {
      str_format(aLineBuf,0x800,"%s %i","ec_auth_timeout");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 0x21) == 0) goto LAB_001298d2;
    }
    if ((this->m_Values).m_EcOutputLevel != 1) {
      str_format(aLineBuf,0x800,"%s %i","ec_output_level");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
    }
  }
LAB_001298d2:
  if (((uVar5 & 0x25) != 0) && ((this->m_Values).m_NetTcpAbortOnClose != 0)) {
    str_format(aLineBuf,0x800,"%s %i","net_tcp_abort_on_close");
    (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
  }
  if (0 < this->m_NumCallbacks) {
    ppvVar9 = &this->m_aCallbacks[0].m_pUserData;
    lVar7 = 0;
    do {
      (*((CCallback *)(ppvVar9 + -1))->m_pfnFunc)(&this->super_IConfigManager,*ppvVar9);
      lVar7 = lVar7 + 1;
      ppvVar9 = ppvVar9 + 2;
    } while (lVar7 < this->m_NumCallbacks);
  }
  io_close(this->m_ConfigFile);
  if (this->m_pConsole != (IConsole *)0x0) {
    str_format(aBuf,0x100,"saved config to \'%s\'",pcVar8);
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"config",aBuf,0);
  }
LAB_0012998a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConfigManager::Save(const char *pFilename)
{
	if(!m_pStorage)
		return;

	if(!pFilename)
		pFilename = SETTINGS_FILENAME ".cfg";
	m_ConfigFile = m_pStorage->OpenFile(pFilename, IOFLAG_WRITE, IStorage::TYPE_SAVE);

	if(!m_ConfigFile)
		return;

	WriteLine("# Teeworlds " GAME_VERSION);

	char aLineBuf[1024*2];
	char aEscapeBuf[1024*2];

	#define MACRO_CONFIG_INT(Name,ScriptName,def,min,max,flags,desc) if(((flags)&(CFGFLAG_SAVE))&&((flags)&(m_FlagMask))&&(m_Values.m_##Name!=int(def))){ str_format(aLineBuf, sizeof(aLineBuf), "%s %i", #ScriptName, m_Values.m_##Name); WriteLine(aLineBuf); }
	#define MACRO_CONFIG_STR(Name,ScriptName,len,def,flags,desc) if(((flags)&(CFGFLAG_SAVE))&&((flags)&(m_FlagMask)&&(str_comp(m_Values.m_##Name,def)))){ EscapeParam(aEscapeBuf, m_Values.m_##Name, sizeof(aEscapeBuf)); str_format(aLineBuf, sizeof(aLineBuf), "%s \"%s\"", #ScriptName, aEscapeBuf); WriteLine(aLineBuf); }
	#define MACRO_CONFIG_UTF8STR(Name,ScriptName,size,len,def,flags,desc) if(((flags)&(CFGFLAG_SAVE))&&((flags)&(m_FlagMask)&&(str_comp(m_Values.m_##Name,def)))){ EscapeParam(aEscapeBuf, m_Values.m_##Name, sizeof(aEscapeBuf)); str_format(aLineBuf, sizeof(aLineBuf), "%s \"%s\"", #ScriptName, aEscapeBuf); WriteLine(aLineBuf); }

	#include "config_variables.h"

	#undef MACRO_CONFIG_INT
	#undef MACRO_CONFIG_STR
	#undef MACRO_CONFIG_UTF8STR

	for(int i = 0; i < m_NumCallbacks; i++)
		m_aCallbacks[i].m_pfnFunc(this, m_aCallbacks[i].m_pUserData);

	io_close(m_ConfigFile);

	if(m_pConsole)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "saved config to '%s'", pFilename);
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "config", aBuf);
	}
}